

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O1

string * __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::operator()[abi_cxx11_
          (string *__return_storage_ptr__,
          rt_latex_translator<viennamath::rt_expression_interface<double>> *this,Interval *e,
          bool use_parenthesis)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," [ ",3);
  process_impl_abi_cxx11_(&local_1c8,this,(e->lower_).rt_expr_._M_ptr,false);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ",2);
  process_impl_abi_cxx11_(&local_1e8,this,(e->upper_).rt_expr_._M_ptr,false);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ] ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(Interval   const & e, bool use_parenthesis = false) const
      {
        std::stringstream ss;
        ss << " [ " << operator()(e.lower()) << "; " << operator()(e.upper()) << " ] ";
        (void)use_parenthesis; //to silence unused parameter warnings
        return ss.str();
      }